

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O0

void __thiscall
MMIntern::HttpClient::HttpClient(HttpClient *this,string *_url,string *_user,string *_password)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  CURLcode res;
  string *_password_local;
  string *_user_local;
  string *_url_local;
  HttpClient *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)_url);
  std::__cxx11::string::string((string *)&this->user,(string *)_user);
  std::__cxx11::string::string((string *)&this->password,(string *)_password);
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"curl_global_init() failed: ");
    pcVar3 = (char *)curl_easy_strerror(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/meteomatics[P]cpp-connector-api/include/Meteomatics_Internals.h"
                  ,0xfb,
                  "MMIntern::HttpClient::HttpClient(const std::string &, const std::string &, const std::string &)"
                 );
  }
  return;
}

Assistant:

MMIntern::HttpClient::HttpClient(const std::string& _url, const std::string& _user, const std::string& _password)
: server(_url)
, user(_user)
, password(_password)
{
    CURLcode res = curl_global_init(CURL_GLOBAL_ALL);
    if(res != CURLE_OK)
    {
        std::cout << "curl_global_init() failed: " << curl_easy_strerror(res) << std::endl;
        assert(false);
    }
}